

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O0

int secp256k1_rangeproof_info
              (secp256k1_context *ctx,int *exp,int *mantissa,uint64_t *min_value,uint64_t *max_value
              ,uchar *proof,size_t plen)

{
  uint64_t *in_RCX;
  int *in_RDX;
  int *in_RSI;
  uint64_t *in_R8;
  uchar *in_R9;
  size_t in_stack_00000008;
  uint64_t scale;
  size_t offset;
  char *in_stack_ffffffffffffffa8;
  secp256k1_callback *in_stack_ffffffffffffffb0;
  uint64_t local_48;
  size_t local_40 [7];
  int local_4;
  
  if (in_RSI == (int *)0x0) {
    secp256k1_callback_call(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    local_4 = 0;
  }
  else if (in_RDX == (int *)0x0) {
    secp256k1_callback_call(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    local_4 = 0;
  }
  else if (in_RCX == (uint64_t *)0x0) {
    secp256k1_callback_call(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    local_4 = 0;
  }
  else if (in_R8 == (uint64_t *)0x0) {
    secp256k1_callback_call(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    local_4 = 0;
  }
  else if (in_R9 == (uchar *)0x0) {
    secp256k1_callback_call(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    local_4 = 0;
  }
  else {
    local_40[0] = 0;
    local_48 = 1;
    local_4 = secp256k1_rangeproof_getheader_impl
                        (local_40,in_RSI,in_RDX,&local_48,in_RCX,in_R8,in_R9,in_stack_00000008);
  }
  return local_4;
}

Assistant:

int secp256k1_rangeproof_info(const secp256k1_context* ctx, int *exp, int *mantissa,
 uint64_t *min_value, uint64_t *max_value, const unsigned char *proof, size_t plen) {
    size_t offset;
    uint64_t scale;
    ARG_CHECK(exp != NULL);
    ARG_CHECK(mantissa != NULL);
    ARG_CHECK(min_value != NULL);
    ARG_CHECK(max_value != NULL);
    ARG_CHECK(proof != NULL);
    offset = 0;
    scale = 1;
    (void)ctx;
    return secp256k1_rangeproof_getheader_impl(&offset, exp, mantissa, &scale, min_value, max_value, proof, plen);
}